

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endianness.h
# Opt level: O0

uint64_t Corrade::Utility::Endianness::Implementation::swap(uint64_t value)

{
  uint64_t value_local;
  
  return value >> 0x38 | (value & 0xff00) << 0x28 | (value & 0xff0000) << 0x18 |
         (value & 0xff000000) << 8 | value >> 8 & 0xff000000 | value >> 0x18 & 0xff0000 |
         value >> 0x28 & 0xff00 | value << 0x38;
}

Assistant:

inline std::uint64_t swap(std::uint64_t value) {
        return (value >> 56) |
              ((value << 40) & 0x00ff000000000000ull) |
              ((value << 24) & 0x0000ff0000000000ull) |
              ((value <<  8) & 0x000000ff00000000ull) |
              ((value >>  8) & 0x00000000ff000000ull) |
              ((value >> 24) & 0x0000000000ff0000ull) |
              ((value >> 40) & 0x000000000000ff00ull) |
               (value << 56);
    }